

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

UINT8 __thiscall S98Player::SetDeviceMuting(S98Player *this,UINT32 id,PLR_MUTE_OPTS *muteOpts)

{
  ulong __n;
  PLR_DEV_OPTS *pPVar1;
  undefined3 uVar2;
  UINT32 UVar3;
  size_t sVar4;
  size_type sVar5;
  reference chipDev;
  size_t devID;
  size_t optID;
  PLR_MUTE_OPTS *muteOpts_local;
  UINT32 id_local;
  S98Player *this_local;
  
  sVar4 = DeviceID2OptionID(this,id);
  if (sVar4 == 0xffffffffffffffff) {
    this_local._7_1_ = 0x80;
  }
  else {
    uVar2 = *(undefined3 *)&muteOpts->field_0x1;
    UVar3 = muteOpts->chnMute[0];
    pPVar1 = this->_devOpts + sVar4;
    (pPVar1->muteOpts).disable = muteOpts->disable;
    *(undefined3 *)&(pPVar1->muteOpts).field_0x1 = uVar2;
    (pPVar1->muteOpts).chnMute[0] = UVar3;
    this->_devOpts[sVar4].muteOpts.chnMute[1] = muteOpts->chnMute[1];
    __n = this->_optDevMap[sVar4];
    sVar5 = std::vector<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>::size
                      (&this->_devices);
    if (__n < sVar5) {
      chipDev = std::vector<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>::
                operator[](&this->_devices,__n);
      RefreshMuting(this,chipDev,&this->_devOpts[sVar4].muteOpts);
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 S98Player::SetDeviceMuting(UINT32 id, const PLR_MUTE_OPTS& muteOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID].muteOpts = muteOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}